

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

bool __thiscall pbrt::Image::WritePNG(Image *this,string *name,ImageMetadata *metadata)

{
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  Point2i p;
  Point2i p_00;
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *this_00;
  int *in_RDI;
  Float v_1;
  Float dither_1;
  int x_1;
  int y_1;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> y8;
  Float v;
  Float dither;
  int c;
  int x;
  int y;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> rgb8;
  int nOutOfGamut;
  uint error;
  uchar *in_stack_fffffffffffffef8;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff00;
  WrapMode in_stack_ffffffffffffff0c;
  WrapMode2D *in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff18;
  LodePNGColorType in_stack_ffffffffffffff1c;
  Float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  uchar *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  Float in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff74;
  Image *in_stack_ffffffffffffff78;
  WrapMode in_stack_ffffffffffffff84;
  float fVar4;
  WrapMode in_stack_ffffffffffffff88;
  WrapMode WVar5;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int local_44;
  int local_40;
  int local_3c;
  int local_28;
  uint local_24;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_24 = 0;
  local_28 = 0;
  if (*in_RDI == 0) {
    iVar2 = NChannels((Image *)0x884845);
    if (iVar2 == 1) {
      std::__cxx11::string::c_str();
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 (in_RDI + 0x2e));
      local_24 = lodepng_encode_file((char *)CONCAT44(in_stack_ffffffffffffff34,
                                                      in_stack_ffffffffffffff30),
                                     in_stack_ffffffffffffff28,(uint)in_stack_ffffffffffffff24,
                                     (uint)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                                     in_stack_ffffffffffffff18);
    }
    else {
      iVar2 = NChannels((Image *)0x8848a4);
      if (iVar2 != 3) {
        NChannels((Image *)0x8848f7);
        LogFatal<int>((LogLevel)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff58,iVar3,
                      (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      }
      std::__cxx11::string::c_str();
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 (in_RDI + 0x2e));
      local_24 = lodepng_encode24_file
                           ((char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0,0x8848e4);
    }
  }
  else {
    iVar3 = NChannels((Image *)0x884934);
    if (iVar3 == 3) {
      std::make_unique<unsigned_char[]>
                (CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      for (local_3c = 0; local_3c < in_RDI[2]; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < in_RDI[1]; local_40 = local_40 + 1) {
          for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
            BlueNoise((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(int)in_stack_ffffffffffffff00
                      ,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                (int)in_stack_fffffffffffffef8);
            WrapMode2D::WrapMode2D(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
            p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffff90;
            p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffff8c;
            wrapMode.wrap.values[1] = in_stack_ffffffffffffff88;
            wrapMode.wrap.values[0] = in_stack_ffffffffffffff84;
            in_stack_ffffffffffffff44 =
                 GetChannel(in_stack_ffffffffffffff78,p,in_stack_ffffffffffffff74,wrapMode);
            if ((in_stack_ffffffffffffff44 < 0.0) || (1.0 < in_stack_ffffffffffffff44)) {
              local_28 = local_28 + 1;
            }
            uVar1 = LinearToSRGB8(SUB84(in_stack_ffffffffffffff00,0),
                                  (Float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            in_stack_ffffffffffffff40 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffff40);
            in_stack_ffffffffffffff38 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
            in_stack_ffffffffffffff38->_M_dataplus =
                 SUB41((uint)in_stack_ffffffffffffff40 >> 0x18,0);
          }
        }
      }
      std::__cxx11::string::c_str();
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                (in_stack_ffffffffffffff00);
      local_24 = lodepng_encode24_file
                           ((char *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0,0x884ba5);
      in_stack_ffffffffffffff34 = local_24;
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (in_stack_ffffffffffffff00);
    }
    else {
      iVar3 = NChannels((Image *)0x884bd2);
      if (iVar3 == 1) {
        std::make_unique<unsigned_char[]>
                  (CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        for (iVar3 = 0; iVar3 < in_RDI[2]; iVar3 = iVar3 + 1) {
          for (WVar5 = Repeat; (int)WVar5 < in_RDI[1]; WVar5 = WVar5 + Black) {
            in_stack_ffffffffffffff24 =
                 BlueNoise((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                           (int)in_stack_ffffffffffffff00,
                           (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            fVar4 = in_stack_ffffffffffffff24 + -0.5;
            Point2<int>::Point2((Point2<int> *)in_stack_ffffffffffffff00,
                                (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                                (int)in_stack_fffffffffffffef8);
            WrapMode2D::WrapMode2D(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
            p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffff90;
            p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar3;
            wrapMode_00.wrap.values[1] = WVar5;
            wrapMode_00.wrap.values[0] = (WrapMode)fVar4;
            in_stack_ffffffffffffff20 =
                 GetChannel(in_stack_ffffffffffffff78,p_00,in_stack_ffffffffffffff74,wrapMode_00);
            if ((in_stack_ffffffffffffff20 < 0.0) || (1.0 < in_stack_ffffffffffffff20)) {
              local_28 = local_28 + 1;
            }
            uVar1 = LinearToSRGB8(SUB84(in_stack_ffffffffffffff00,0),
                                  (Float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            in_stack_ffffffffffffff1c = CONCAT13(uVar1,(int3)in_stack_ffffffffffffff1c);
            in_stack_ffffffffffffff10 =
                 (WrapMode2D *)
                 std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
            *(char *)(in_stack_ffffffffffffff10->wrap).values =
                 (char)(in_stack_ffffffffffffff1c >> 0x18);
          }
        }
        this_00 = (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                  std::__cxx11::string::c_str();
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(this_00);
        local_24 = lodepng_encode_file((char *)CONCAT44(in_stack_ffffffffffffff34,
                                                        in_stack_ffffffffffffff30),
                                       in_stack_ffffffffffffff28,(uint)in_stack_ffffffffffffff24,
                                       (uint)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                                       in_stack_ffffffffffffff18);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  (this_00);
      }
    }
  }
  if (0 < local_28) {
    Warning<std::__cxx11::string_const&,int&>
              ((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,
               (int *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  if (local_24 != 0) {
    lodepng_error_text(local_24);
    Error<std::__cxx11::string_const&,char_const*>
              ((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,
               (char **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  return local_24 == 0;
}

Assistant:

bool Image::WritePNG(const std::string &name, const ImageMetadata &metadata) const {
    unsigned int error = 0;
    int nOutOfGamut = 0;

    if (format == PixelFormat::U256) {
        if (NChannels() == 1)
            error = lodepng_encode_file(name.c_str(), p8.data(), resolution.x,
                                        resolution.y, LCT_GREY, 8 /* bitdepth */);
        else if (NChannels() == 3)
            // TODO: it would be nice to store the color encoding used in the
            // PNG metadata...
            error = lodepng_encode24_file(name.c_str(), p8.data(), resolution.x,
                                          resolution.y);
        else
            LOG_FATAL("Unhandled channel count in WritePNG(): %d", NChannels());
    } else if (NChannels() == 3) {
        // It may not actually be RGB, but that's what PNG's going to
        // assume..
        std::unique_ptr<uint8_t[]> rgb8 =
            std::make_unique<uint8_t[]>(3 * resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x)
                for (int c = 0; c < 3; ++c) {
                    Float dither = -.5f + BlueNoise(c, x, y);
                    Float v = GetChannel({x, y}, c);
                    if (v < 0 || v > 1)
                        ++nOutOfGamut;
                    rgb8[3 * (y * resolution.x + x) + c] = LinearToSRGB8(v, dither);
                }

        error =
            lodepng_encode24_file(name.c_str(), rgb8.get(), resolution.x, resolution.y);
    } else if (NChannels() == 1) {
        std::unique_ptr<uint8_t[]> y8 =
            std::make_unique<uint8_t[]>(resolution.x * resolution.y);
        for (int y = 0; y < resolution.y; ++y)
            for (int x = 0; x < resolution.x; ++x) {
                Float dither = -.5f + BlueNoise(0, x, y);
                Float v = GetChannel({x, y}, 0);
                if (v < 0 || v > 1)
                    ++nOutOfGamut;
                y8[y * resolution.x + x] = LinearToSRGB8(v, dither);
            }

        error = lodepng_encode_file(name.c_str(), y8.get(), resolution.x, resolution.y,
                                    LCT_GREY, 8 /* bitdepth */);
    }

    if (nOutOfGamut > 0)
        Warning("%s: %d out of gamut pixel channels clamped to [0,1].", name,
                nOutOfGamut);

    if (error != 0) {
        Error("Error writing PNG \"%s\": %s", name, lodepng_error_text(error));
        return false;
    }
    return true;
}